

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O3

int __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::LoadGet_ndof_w(ChLoad<chrono::ChLoaderGravity> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  element_type *peVar2;
  
  peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    peVar2 = peVar2 + *(long *)(*(long *)peVar2 + -0x78);
  }
  this_00 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
            super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar1 = (**(code **)(*(long *)peVar2 + 0x18))();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return iVar1;
}

Assistant:

inline int ChLoad<Tloader>::LoadGet_ndof_w() {
    return this->loader.GetLoadable()->LoadableGet_ndof_w();
}